

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_block_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_11af45a::ErrorBlockTest_OperationCheck_Test::TestBody
          (ErrorBlockTest_OperationCheck_Test *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  AssertHelper *pAVar4;
  Message *pMVar5;
  long in_RDI;
  AssertionResult gtest_ar;
  RegisterStateCheckMMX reg_check_mmx;
  RegisterStateCheck reg_check;
  int j;
  int err_count;
  int i;
  int msb;
  int64_t ref_ret;
  int64_t ref_ssz;
  int64_t ret;
  int64_t ssz;
  intptr_t block_size;
  int first_failure;
  int err_count_total;
  tran_low_t dqcoeff [4096];
  tran_low_t coeff [4096];
  ACMRandom rnd;
  undefined4 in_stack_ffffffffffff7f08;
  int in_stack_ffffffffffff7f0c;
  Message *in_stack_ffffffffffff7f10;
  int *in_stack_ffffffffffff7f18;
  char *in_stack_ffffffffffff7f20;
  char *in_stack_ffffffffffff7f28;
  AssertionResult *this_00;
  undefined4 in_stack_ffffffffffff7f3c;
  Type type;
  AssertHelper *in_stack_ffffffffffff7f40;
  AssertionResult local_8098 [2];
  Message *in_stack_ffffffffffff7f88;
  AssertHelper *in_stack_ffffffffffff7f90;
  int local_8058;
  int local_8050;
  long local_8040;
  AssertHelper *local_8038;
  long local_8030;
  long local_8028;
  int local_8020;
  int local_801c;
  int local_8018 [4096];
  int local_4018 [4102];
  
  libaom_test::ACMRandom::DeterministicSeed();
  libaom_test::ACMRandom::ACMRandom
            ((ACMRandom *)in_stack_ffffffffffff7f10,in_stack_ffffffffffff7f0c);
  local_801c = 0;
  local_8020 = -1;
  for (local_8050 = 0; local_8050 < 1000; local_8050 = local_8050 + 1) {
    local_8028 = (long)(0x10 << ((byte)((long)local_8050 % 9) & 0x1f));
    for (local_8058 = 0; local_8058 < local_8028; local_8058 = local_8058 + 1) {
      iVar2 = libaom_test::ACMRandom::operator()
                        ((ACMRandom *)in_stack_ffffffffffff7f10,in_stack_ffffffffffff7f0c);
      if (iVar2 == 0) {
        iVar2 = libaom_test::ACMRandom::operator()
                          ((ACMRandom *)in_stack_ffffffffffff7f10,in_stack_ffffffffffff7f0c);
        local_4018[local_8058] = -iVar2;
        iVar2 = libaom_test::ACMRandom::operator()
                          ((ACMRandom *)in_stack_ffffffffffff7f10,in_stack_ffffffffffff7f0c);
        local_8018[local_8058] = -iVar2;
      }
      else {
        iVar2 = libaom_test::ACMRandom::operator()
                          ((ACMRandom *)in_stack_ffffffffffff7f10,in_stack_ffffffffffff7f0c);
        local_4018[local_8058] = iVar2;
        iVar2 = libaom_test::ACMRandom::operator()
                          ((ACMRandom *)in_stack_ffffffffffff7f10,in_stack_ffffffffffff7f0c);
        local_8018[local_8058] = iVar2;
      }
    }
    pAVar4 = (AssertHelper *)
             (**(code **)(in_RDI + 0x28))
                       (local_4018,local_8018,local_8028,&local_8040,*(undefined4 *)(in_RDI + 0x18))
    ;
    libaom_test::RegisterStateCheckMMX::RegisterStateCheckMMX
              ((RegisterStateCheckMMX *)&stack0xffffffffffff7f8a);
    in_stack_ffffffffffff7f40 =
         (AssertHelper *)
         (**(code **)(in_RDI + 0x20))
                   (local_4018,local_8018,local_8028,&local_8030,*(undefined4 *)(in_RDI + 0x18));
    local_8038 = in_stack_ffffffffffff7f40;
    libaom_test::RegisterStateCheckMMX::~RegisterStateCheckMMX((RegisterStateCheckMMX *)0xb1bcde);
    uVar3 = (uint)(pAVar4 != local_8038 || local_8040 != local_8030);
    if ((uVar3 != 0) && (local_801c == 0)) {
      local_8020 = local_8050;
    }
    local_801c = uVar3 + local_801c;
  }
  this_00 = local_8098;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_ffffffffffff7f28,in_stack_ffffffffffff7f20,in_stack_ffffffffffff7f18,
             (int *)in_stack_ffffffffffff7f10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  type = CONCAT13(bVar1,(int3)in_stack_ffffffffffff7f3c);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffff7f40);
    pMVar5 = testing::Message::operator<<
                       (in_stack_ffffffffffff7f10,
                        (char (*) [67])CONCAT44(in_stack_ffffffffffff7f0c,in_stack_ffffffffffff7f08)
                       );
    iVar2 = (int)((ulong)pMVar5 >> 0x20);
    pMVar5 = testing::Message::operator<<
                       (in_stack_ffffffffffff7f10,
                        (char (*) [27])CONCAT44(in_stack_ffffffffffff7f0c,in_stack_ffffffffffff7f08)
                       );
    testing::Message::operator<<
              (in_stack_ffffffffffff7f10,
               (int *)CONCAT44(in_stack_ffffffffffff7f0c,in_stack_ffffffffffff7f08));
    pAVar4 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xb1be51);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffff7f40,type,&this_00->success_,iVar2,(char *)pMVar5);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffff7f90,in_stack_ffffffffffff7f88);
    testing::internal::AssertHelper::~AssertHelper(pAVar4);
    testing::Message::~Message((Message *)0xb1be9f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb1bedf);
  return;
}

Assistant:

TEST_P(ErrorBlockTest, OperationCheck) {
  ACMRandom rnd(ACMRandom::DeterministicSeed());
  DECLARE_ALIGNED(16, tran_low_t, coeff[4096]);
  DECLARE_ALIGNED(16, tran_low_t, dqcoeff[4096]);
  int err_count_total = 0;
  int first_failure = -1;
  intptr_t block_size;
  int64_t ssz;
  int64_t ret;
  int64_t ref_ssz;
  int64_t ref_ret;
  const int msb = bit_depth_ + 8 - 1;
  for (int i = 0; i < kNumIterations; ++i) {
    int err_count = 0;
    block_size = 16 << (i % 9);  // All block sizes from 4x4, 8x4 ..64x64
    for (int j = 0; j < block_size; j++) {
      // coeff and dqcoeff will always have at least the same sign, and this
      // can be used for optimization, so generate test input precisely.
      if (rnd(2)) {
        // Positive number
        coeff[j] = rnd(1 << msb);
        dqcoeff[j] = rnd(1 << msb);
      } else {
        // Negative number
        coeff[j] = -rnd(1 << msb);
        dqcoeff[j] = -rnd(1 << msb);
      }
    }
    ref_ret =
        ref_error_block_op_(coeff, dqcoeff, block_size, &ref_ssz, bit_depth_);
    API_REGISTER_STATE_CHECK(
        ret = error_block_op_(coeff, dqcoeff, block_size, &ssz, bit_depth_));
    err_count += (ref_ret != ret) | (ref_ssz != ssz);
    if (err_count && !err_count_total) {
      first_failure = i;
    }
    err_count_total += err_count;
  }
  EXPECT_EQ(0, err_count_total)
      << "Error: Error Block Test, C output doesn't match optimized output. "
      << "First failed at test case " << first_failure;
}